

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_intmin_max(ASMState *as,IRIns *ir,int cc)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  Reg dest;
  Reg r2;
  MCode *pMVar4;
  uint uVar5;
  uint uVar6;
  uint local_34;
  
  dest = ra_dest(as,ir,0xffef);
  uVar2 = (ir->field_0).op1;
  uVar3 = (ir->field_0).op2;
  uVar5 = (uint)uVar3;
  if (-1 < (short)uVar3) {
    uVar5 = (uint)uVar2;
  }
  bVar1 = *(byte *)((long)as->ir + (ulong)uVar5 * 8 + 6);
  r2 = (Reg)bVar1;
  if ((char)bVar1 < '\0') {
    r2 = ra_allocref(as,uVar5,~(1 << (dest & 0x1f)) & 0xffef);
  }
  bVar1 = (byte)r2 & 0x1f;
  as->weakset = as->weakset & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
  uVar5._0_2_ = *(IROpT *)((long)ir + 4);
  uVar5._2_2_ = *(IRRef1 *)((long)ir + 6);
  emit_rr(as,cc * 0x1000000 + XO_CMOV,
          -(uint)((0x604208U >> (uVar5 & 0x1f) & 1) != 0) & 0x80200 | dest,r2);
  uVar6._0_2_ = *(IROpT *)((long)ir + 4);
  uVar6._2_2_ = *(IRRef1 *)((long)ir + 6);
  uVar5 = -(uint)((0x604208U >> (uVar6 & 0x1f) & 1) != 0) & 0x80200;
  pMVar4 = as->mcp;
  pMVar4[-1] = ((byte)r2 & 7) + (char)dest * '\b' | 0xc0;
  pMVar4[-2] = ';';
  uVar6 = r2 >> 3 & 1 | (uVar5 | dest) >> 1 & 0x104;
  if (uVar6 == 0) {
    pMVar4 = pMVar4 + -2;
  }
  else {
    pMVar4[-3] = (byte)uVar6 | (byte)(uVar5 >> 0x10) | 0x40;
    pMVar4 = pMVar4 + -3;
  }
  local_34 = (uint)uVar2;
  if (-1 < (short)uVar3) {
    local_34 = (uint)uVar3;
  }
  as->mcp = pMVar4;
  ra_left(as,dest,local_34);
  return;
}

Assistant:

static void asm_intmin_max(ASMState *as, IRIns *ir, int cc)
{
  Reg right, dest = ra_dest(as, ir, RSET_GPR);
  IRRef lref = ir->op1, rref = ir->op2;
  if (irref_isk(rref)) { lref = rref; rref = ir->op1; }
  right = ra_alloc1(as, rref, rset_exclude(RSET_GPR, dest));
  emit_rr(as, XO_CMOV + (cc<<24), REX_64IR(ir, dest), right);
  emit_rr(as, XO_CMP, REX_64IR(ir, dest), right);
  ra_left(as, dest, lref);
}